

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAnalogEvent.cpp
# Opt level: O1

float __thiscall MinVR::VRAnalogEvent::getValue(VRAnalogEvent *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VRDataIndex *pVVar2;
  pointer pcVar3;
  bool bVar4;
  VRAnyCoreType VVar5;
  VRError *this_00;
  long *plVar6;
  size_type *psVar7;
  float extraout_XMM0_Da;
  string local_138;
  float local_118;
  int local_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar2 = this->_index;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AnalogValue","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  bVar4 = VRDataIndex::exists(pVVar2,&local_138,&local_f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pVVar2 = this->_index;
    local_138._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"AnalogValue","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    VVar5 = VRDataIndex::getValue(pVVar2,&local_138,&local_110,true);
    (*(VVar5.datum)->_vptr_VRDatum[8])(VVar5.datum);
    local_118 = extraout_XMM0_Da;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    return local_118;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (this->_index->_indexName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->_index->_indexName)._M_string_length);
  std::operator+(&local_50,
                 "VRAnalogEvent::getValue() cannot determine a data field to return for event named "
                 ,&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_138._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar7) {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138.field_2._8_4_ = (undefined4)plVar6[3];
    local_138.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar7;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Analog events should have an entry in their data index called AnalogValue.","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/api/impl/VRAnalogEvent.cpp"
             ,"");
  local_114 = 0x28;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"float MinVR::VRAnalogEvent::getValue() const","");
  VRError::VRError(this_00,&local_138,&local_90,&local_b0,&local_114,&local_d0);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

float VRAnalogEvent::getValue() const {
    if (_index.exists("AnalogValue")) {
        return _index.getValue("AnalogValue");
    }
    else {
        VRERROR("VRAnalogEvent::getValue() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Analog events should have an entry in their data index called AnalogValue.");
        return 0.0f;
    }
}